

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O1

void __thiscall
axl::sl::
OwningListBase<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>,_axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::mem::Delete<RwLockThread>_>
::~OwningListBase(OwningListBase<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>,_axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::mem::Delete<RwLockThread>_>
                  *this)

{
  RwLockThread *pRVar1;
  RwLockThread *p;
  RwLockThread *pRVar2;
  
  pRVar2 = (this->
           super_ListBase<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>,_axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>_>
           ).super_ListData<RwLockThread>.m_head;
  if (pRVar2 != (RwLockThread *)0x0) {
    do {
      pRVar1 = (RwLockThread *)(pRVar2->super_ListLink).m_next;
      sys::ReadWriteLock::~ReadWriteLock(&pRVar2->m_lock);
      sys::ThreadImpl<RwLockThread>::~ThreadImpl(&pRVar2->super_ThreadImpl<RwLockThread>);
      operator_delete(pRVar2);
      pRVar2 = pRVar1;
    } while (pRVar1 != (RwLockThread *)0x0);
    (this->
    super_ListBase<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>,_axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>_>
    ).super_ListData<RwLockThread>.m_head = (RwLockThread *)0x0;
    (this->
    super_ListBase<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>,_axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>_>
    ).super_ListData<RwLockThread>.m_tail = (RwLockThread *)0x0;
    (this->
    super_ListBase<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>,_axl::sl::Iterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<RwLockThread,_axl::sl::ImplicitPtrCast<RwLockThread,_axl::sl::ListLink>_>_>
    ).super_ListData<RwLockThread>.m_count = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}